

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

xmlNotationPtr
xmlAddNotationDecl(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *name,xmlChar *PublicID,
                  xmlChar *SystemID)

{
  int iVar1;
  xmlHashTablePtr table;
  xmlNotationPtr nota;
  xmlChar *pxVar2;
  _xmlDict *dict;
  char *extra;
  
  if ((name != (xmlChar *)0x0 && dtd != (xmlDtdPtr)0x0) &&
     (PublicID != (xmlChar *)0x0 || SystemID != (xmlChar *)0x0)) {
    table = (xmlHashTablePtr)dtd->notations;
    if (table == (xmlHashTablePtr)0x0) {
      if (dtd->doc == (_xmlDoc *)0x0) {
        dict = (xmlDictPtr)0x0;
      }
      else {
        dict = dtd->doc->dict;
      }
      table = xmlHashCreateDict(0,dict);
      dtd->notations = table;
    }
    if (table == (xmlHashTablePtr)0x0) {
      extra = "xmlAddNotationDecl: Table creation failed!\n";
    }
    else {
      nota = (xmlNotationPtr)(*xmlMalloc)(0x18);
      if (nota != (xmlNotationPtr)0x0) {
        nota->name = (xmlChar *)0x0;
        nota->PublicID = (xmlChar *)0x0;
        nota->SystemID = (xmlChar *)0x0;
        pxVar2 = xmlStrdup(name);
        nota->name = pxVar2;
        if (SystemID != (xmlChar *)0x0) {
          pxVar2 = xmlStrdup(SystemID);
          nota->SystemID = pxVar2;
        }
        if (PublicID != (xmlChar *)0x0) {
          pxVar2 = xmlStrdup(PublicID);
          nota->PublicID = pxVar2;
        }
        iVar1 = xmlHashAddEntry(table,name,nota);
        if (iVar1 != 0) {
          __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                          (void *)0x0,(void *)0x0,0x17,0x20e,XML_ERR_ERROR,(char *)0x0,0,
                          (char *)name,(char *)0x0,(char *)0x0,0,0,
                          "xmlAddNotationDecl: %s already defined\n",name);
          xmlFreeNotation(nota);
          return (xmlNotationPtr)0x0;
        }
        return nota;
      }
      extra = "malloc failed";
    }
    xmlVErrMemory(ctxt,extra);
  }
  return (xmlNotationPtr)0x0;
}

Assistant:

xmlNotationPtr
xmlAddNotationDecl(xmlValidCtxtPtr ctxt, xmlDtdPtr dtd,
	           const xmlChar *name,
                   const xmlChar *PublicID, const xmlChar *SystemID) {
    xmlNotationPtr ret;
    xmlNotationTablePtr table;

    if (dtd == NULL) {
	return(NULL);
    }
    if (name == NULL) {
	return(NULL);
    }
    if ((PublicID == NULL) && (SystemID == NULL)) {
	return(NULL);
    }

    /*
     * Create the Notation table if needed.
     */
    table = (xmlNotationTablePtr) dtd->notations;
    if (table == NULL) {
	xmlDictPtr dict = NULL;
	if (dtd->doc != NULL)
	    dict = dtd->doc->dict;

        dtd->notations = table = xmlHashCreateDict(0, dict);
    }
    if (table == NULL) {
	xmlVErrMemory(ctxt,
		"xmlAddNotationDecl: Table creation failed!\n");
        return(NULL);
    }

    ret = (xmlNotationPtr) xmlMalloc(sizeof(xmlNotation));
    if (ret == NULL) {
	xmlVErrMemory(ctxt, "malloc failed");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlNotation));

    /*
     * fill the structure.
     */
    ret->name = xmlStrdup(name);
    if (SystemID != NULL)
        ret->SystemID = xmlStrdup(SystemID);
    if (PublicID != NULL)
        ret->PublicID = xmlStrdup(PublicID);

    /*
     * Validity Check:
     * Check the DTD for previous declarations of the ATTLIST
     */
    if (xmlHashAddEntry(table, name, ret)) {
#ifdef LIBXML_VALID_ENABLED
	xmlErrValid(NULL, XML_DTD_NOTATION_REDEFINED,
		    "xmlAddNotationDecl: %s already defined\n",
		    (const char *) name);
#endif /* LIBXML_VALID_ENABLED */
	xmlFreeNotation(ret);
	return(NULL);
    }
    return(ret);
}